

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::emit_function_prototype
          (CompilerHLSL *this,SPIRFunction *func,Bitset *return_flags)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  SPIREntryPoint *pSVar4;
  char *pcVar5;
  CompilerError *this_00;
  SPIRType *type_00;
  spirv_cross local_360 [32];
  SPIRVariable *local_340;
  SPIRVariable *var_1;
  Parameter *local_318;
  Parameter *arg_1;
  Parameter *__end1_1;
  Parameter *__begin1_1;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *__range1_1;
  SPIRVariable *var;
  undefined1 local_2d0 [72];
  SPIRType *local_288;
  SPIRType *arg_type;
  Parameter *local_260;
  Parameter *arg;
  Parameter *__end1;
  Parameter *__begin1;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *__range1;
  string local_220 [32];
  string local_200 [8];
  string out_argument;
  undefined1 local_1e0 [8];
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  arglist;
  allocator local_a1;
  string local_a0 [32];
  string local_80 [48];
  SPIRType *local_50;
  SPIRType *type;
  string decl;
  SPIREntryPoint *execution;
  Bitset *return_flags_local;
  SPIRFunction *func_local;
  CompilerHLSL *this_local;
  
  bVar1 = TypedID<(spirv_cross::Types)0>::operator!=
                    (&(func->super_IVariant).self,
                     &(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  if (bVar1) {
    CompilerGLSL::add_function_overload(&this->super_CompilerGLSL,func);
  }
  pSVar4 = Compiler::get_entry_point((Compiler *)this);
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_CompilerGLSL).local_variable_names,
              &(this->super_CompilerGLSL).resource_names);
  ::std::__cxx11::string::string((string *)&type);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(func->super_IVariant).field_0xc);
  local_50 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  bVar1 = VectorView<unsigned_int>::empty(&(local_50->array).super_VectorView<unsigned_int>);
  if (bVar1) {
    pcVar5 = CompilerGLSL::flags_to_qualifiers_glsl(&this->super_CompilerGLSL,local_50,return_flags)
    ;
    ::std::__cxx11::string::operator+=((string *)&type,pcVar5);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_80,this,local_50,0);
    ::std::__cxx11::string::operator+=((string *)&type,local_80);
    ::std::__cxx11::string::~string(local_80);
    ::std::__cxx11::string::operator+=((string *)&type," ");
  }
  else {
    ::std::__cxx11::string::operator=((string *)&type,"void ");
  }
  bVar1 = TypedID<(spirv_cross::Types)0>::operator==
                    (&(func->super_IVariant).self,
                     &(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  if (bVar1) {
    if (pSVar4->model == ExecutionModelVertex) {
      ::std::__cxx11::string::operator+=((string *)&type,"vert_main");
    }
    else if (pSVar4->model == ExecutionModelFragment) {
      ::std::__cxx11::string::operator+=((string *)&type,"frag_main");
    }
    else {
      if (pSVar4->model != ExecutionModelGLCompute) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_a0,"Unsupported execution model.",&local_a1);
        CompilerError::CompilerError(this_00,(string *)local_a0);
        __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      ::std::__cxx11::string::operator+=((string *)&type,"comp_main");
    }
    (this->super_CompilerGLSL).processing_entry_point = true;
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(func->super_IVariant).self);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (arglist.stack_storage.aligned_char + 0xf8,this,(ulong)uVar2,1);
    ::std::__cxx11::string::operator+=
              ((string *)&type,(string *)(arglist.stack_storage.aligned_char + 0xf8));
    ::std::__cxx11::string::~string((string *)(arglist.stack_storage.aligned_char + 0xf8));
  }
  ::std::__cxx11::string::operator+=((string *)&type,"(");
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1e0);
  bVar1 = VectorView<unsigned_int>::empty(&(local_50->array).super_VectorView<unsigned_int>);
  if (!bVar1) {
    ::std::__cxx11::string::string(local_200);
    ::std::__cxx11::string::operator+=(local_200,"out ");
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_220,this,local_50,0);
    ::std::__cxx11::string::operator+=(local_200,local_220);
    ::std::__cxx11::string::~string(local_220);
    ::std::__cxx11::string::operator+=(local_200," ");
    ::std::__cxx11::string::operator+=(local_200,"SPIRV_Cross_return_value");
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x23])(&__range1,this,local_50);
    ::std::__cxx11::string::operator+=(local_200,(string *)&__range1);
    ::std::__cxx11::string::~string((string *)&__range1);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1e0,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200);
    ::std::__cxx11::string::~string(local_200);
  }
  __begin1 = (Parameter *)&func->arguments;
  __end1 = VectorView<spirv_cross::SPIRFunction::Parameter>::begin
                     ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin1);
  arg = VectorView<spirv_cross::SPIRFunction::Parameter>::end
                  ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin1);
  for (; __end1 != arg; __end1 = __end1 + 1) {
    local_260 = __end1;
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->id);
    uVar3 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x2f])(this,(ulong)uVar2);
    if ((uVar3 & 1) == 0) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_260->id);
      CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,uVar2);
      CompilerGLSL::argument_decl_abi_cxx11_((CompilerGLSL *)&arg_type,(Parameter *)this);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1e0,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arg_type);
      ::std::__cxx11::string::~string((string *)&arg_type);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)local_260);
      type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
      local_288 = type_00;
      if (((0x1e < *(uint *)&(this->super_CompilerGLSL).field_0x241c) &&
          (*(int *)&(type_00->super_IVariant).field_0xc == 0x11)) &&
         ((type_00->image).dim != DimBuffer)) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_260->id);
        bVar1 = Compiler::image_is_comparison((Compiler *)this,type_00,uVar2);
        local_2d0._32_8_ = "SamplerState ";
        if (bVar1) {
          local_2d0._32_8_ = "SamplerComparisonState ";
        }
        TypedID::operator_cast_to_unsigned_int((TypedID *)&local_260->id);
        to_sampler_expression_abi_cxx11_((CompilerHLSL *)local_2d0,(uint32_t)this);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x23])(&var,this,local_288);
        join<char_const*,std::__cxx11::string,std::__cxx11::string>
                  ((spirv_cross *)(local_2d0 + 0x28),(char **)(local_2d0 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_1e0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_2d0 + 0x28));
        ::std::__cxx11::string::~string((string *)(local_2d0 + 0x28));
        ::std::__cxx11::string::~string((string *)&var);
        ::std::__cxx11::string::~string((string *)local_2d0);
      }
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_260->id);
      __range1_1 = (SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                   Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,uVar2);
      if ((SPIRVariable *)__range1_1 != (SPIRVariable *)0x0) {
        ((SPIRVariable *)__range1_1)->parameter = local_260;
      }
    }
  }
  __begin1_1 = (Parameter *)&func->shadow_arguments;
  __end1_1 = VectorView<spirv_cross::SPIRFunction::Parameter>::begin
                       ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin1_1);
  arg_1 = VectorView<spirv_cross::SPIRFunction::Parameter>::end
                    ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin1_1);
  for (; __end1_1 != arg_1; __end1_1 = __end1_1 + 1) {
    local_318 = __end1_1;
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1_1->id);
    CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,uVar2);
    CompilerGLSL::argument_decl_abi_cxx11_((CompilerGLSL *)&var_1,(Parameter *)this);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1e0,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var_1);
    ::std::__cxx11::string::~string((string *)&var_1);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_318->id);
    local_340 = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,uVar2);
    if (local_340 != (SPIRVariable *)0x0) {
      local_340->parameter = local_318;
    }
  }
  merge(local_360,
        (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
         *)local_1e0,", ");
  ::std::__cxx11::string::operator+=((string *)&type,(string *)local_360);
  ::std::__cxx11::string::~string((string *)local_360);
  ::std::__cxx11::string::operator+=((string *)&type,")");
  CompilerGLSL::statement<std::__cxx11::string&>
            (&this->super_CompilerGLSL,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                  *)local_1e0);
  ::std::__cxx11::string::~string((string *)&type);
  return;
}

Assistant:

void CompilerHLSL::emit_function_prototype(SPIRFunction &func, const Bitset &return_flags)
{
	if (func.self != ir.default_entry_point)
		add_function_overload(func);

	auto &execution = get_entry_point();
	// Avoid shadow declarations.
	local_variable_names = resource_names;

	string decl;

	auto &type = get<SPIRType>(func.return_type);
	if (type.array.empty())
	{
		decl += flags_to_qualifiers_glsl(type, return_flags);
		decl += type_to_glsl(type);
		decl += " ";
	}
	else
	{
		// We cannot return arrays in HLSL, so "return" through an out variable.
		decl = "void ";
	}

	if (func.self == ir.default_entry_point)
	{
		if (execution.model == ExecutionModelVertex)
			decl += "vert_main";
		else if (execution.model == ExecutionModelFragment)
			decl += "frag_main";
		else if (execution.model == ExecutionModelGLCompute)
			decl += "comp_main";
		else
			SPIRV_CROSS_THROW("Unsupported execution model.");
		processing_entry_point = true;
	}
	else
		decl += to_name(func.self);

	decl += "(";
	SmallVector<string> arglist;

	if (!type.array.empty())
	{
		// Fake array returns by writing to an out array instead.
		string out_argument;
		out_argument += "out ";
		out_argument += type_to_glsl(type);
		out_argument += " ";
		out_argument += "SPIRV_Cross_return_value";
		out_argument += type_to_array_glsl(type);
		arglist.push_back(move(out_argument));
	}

	for (auto &arg : func.arguments)
	{
		// Do not pass in separate images or samplers if we're remapping
		// to combined image samplers.
		if (skip_argument(arg.id))
			continue;

		// Might change the variable name if it already exists in this function.
		// SPIRV OpName doesn't have any semantic effect, so it's valid for an implementation
		// to use same name for variables.
		// Since we want to make the GLSL debuggable and somewhat sane, use fallback names for variables which are duplicates.
		add_local_variable_name(arg.id);

		arglist.push_back(argument_decl(arg));

		// Flatten a combined sampler to two separate arguments in modern HLSL.
		auto &arg_type = get<SPIRType>(arg.type);
		if (hlsl_options.shader_model > 30 && arg_type.basetype == SPIRType::SampledImage &&
		    arg_type.image.dim != DimBuffer)
		{
			// Manufacture automatic sampler arg for SampledImage texture
			arglist.push_back(join(image_is_comparison(arg_type, arg.id) ? "SamplerComparisonState " : "SamplerState ",
			                       to_sampler_expression(arg.id), type_to_array_glsl(arg_type)));
		}

		// Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
			var->parameter = &arg;
	}

	for (auto &arg : func.shadow_arguments)
	{
		// Might change the variable name if it already exists in this function.
		// SPIRV OpName doesn't have any semantic effect, so it's valid for an implementation
		// to use same name for variables.
		// Since we want to make the GLSL debuggable and somewhat sane, use fallback names for variables which are duplicates.
		add_local_variable_name(arg.id);

		arglist.push_back(argument_decl(arg));

		// Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
			var->parameter = &arg;
	}

	decl += merge(arglist);
	decl += ")";
	statement(decl);
}